

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathHasSameNodes(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  xmlNodePtr val;
  ulong uVar4;
  
  iVar3 = 0;
  iVar2 = 0;
  if ((((nodes1 != (xmlNodeSetPtr)0x0) && (uVar1 = nodes1->nodeNr, iVar2 = iVar3, uVar1 != 0)) &&
      (nodes2 != (xmlNodeSetPtr)0x0)) &&
     (((nodes1->nodeTab != (xmlNodePtr *)0x0 && (nodes2->nodeNr != 0)) &&
      (nodes2->nodeTab != (xmlNodePtr *)0x0)))) {
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar4 = 0;
    do {
      if (uVar1 == uVar4) {
        return 0;
      }
      if ((long)uVar4 < (long)nodes1->nodeNr) {
        val = nodes1->nodeTab[uVar4];
      }
      else {
        val = (xmlNodePtr)0x0;
      }
      iVar2 = xmlXPathNodeSetContains(nodes2,val);
      uVar4 = uVar4 + 1;
    } while (iVar2 == 0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
xmlXPathHasSameNodes (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    int i, l;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes1) ||
	xmlXPathNodeSetIsEmpty(nodes2))
	return(0);

    l = xmlXPathNodeSetGetLength(nodes1);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (xmlXPathNodeSetContains(nodes2, cur))
	    return(1);
    }
    return(0);
}